

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_locate_nnodes(Integer g_a,Integer *lo,Integer *hi,Integer *np)

{
  long lVar1;
  long lVar2;
  short sVar3;
  uint uVar4;
  C_Integer *pCVar5;
  long lVar6;
  global_array_t *pgVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int proc_subscript [7];
  int procB [7];
  int procT [7];
  uint local_198 [8];
  uint local_178 [16];
  uint local_138 [66];
  
  lVar2 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar2)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_locate_nnodes");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar2].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_locate_nnodes");
    pnga_error((char *)local_138,g_a);
  }
  pgVar7 = GA;
  sVar3 = GA[lVar2].ndim;
  lVar18 = (long)sVar3;
  if (lVar18 < 1) {
    if (GA[lVar2].distr_type != 0) goto LAB_00175425;
  }
  else {
    lVar9 = 0;
    do {
      if (lo[lVar9] < 1) {
        return 0;
      }
      if (hi[lVar9] < lo[lVar9]) {
        return 0;
      }
      if (GA[lVar2].dims[lVar9] < hi[lVar9]) {
        return 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar18 != lVar9);
    if (GA[lVar2].distr_type != 0) {
LAB_00175425:
      lVar2 = GA[lVar2].block_total;
      lVar9 = 0;
      if (0 < lVar2) {
        lVar13 = 0;
        do {
          pnga_distribution(g_a,lVar13,(Integer *)local_138,(Integer *)local_178);
          lVar14 = 1;
          if (0 < sVar3) {
            lVar10 = 0;
            do {
              if (((*(long *)(local_138 + lVar10 * 2) < lo[lVar10]) ||
                  (hi[lVar10] < *(long *)(local_138 + lVar10 * 2))) &&
                 ((*(long *)(local_178 + lVar10 * 2) < lo[lVar10] ||
                  (hi[lVar10] < *(long *)(local_178 + lVar10 * 2))))) {
                lVar14 = 0;
                break;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < lVar18);
          }
          lVar9 = lVar9 + lVar14;
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar2);
      }
      *np = lVar9;
      return 1;
    }
    if (0 < sVar3) {
      pCVar5 = GA[lVar2].mapc;
      lVar9 = 0;
      lVar13 = 0;
      do {
        lVar14 = lo[lVar9];
        uVar15 = (uint)((double)lVar14 * GA[lVar2].scale[lVar9]);
        uVar4 = GA[lVar2].nblock[lVar9];
        uVar17 = uVar4 - 1;
        if (uVar4 == uVar15) {
          uVar15 = uVar17;
        }
        lVar10 = (long)(int)uVar15;
        if (lVar14 < pCVar5[lVar13 + lVar10]) {
          plVar12 = pCVar5 + lVar13 + ((ulong)uVar15 - 1);
          do {
            uVar16 = uVar17;
            if ((int)uVar15 < 1) break;
            uVar16 = uVar15 - 1;
            lVar10 = *plVar12;
            plVar12 = plVar12 + -1;
            uVar15 = uVar16;
          } while (lVar14 < lVar10);
        }
        else {
          uVar8 = uVar17;
          if ((int)uVar17 < (int)uVar15) {
            uVar8 = uVar15;
          }
          lVar11 = 0;
          do {
            uVar16 = uVar17;
            if ((int)uVar8 - lVar10 == lVar11) goto LAB_001752c2;
            lVar1 = lVar11 + 1;
            lVar6 = lVar11 + 1;
            lVar11 = lVar1;
          } while (pCVar5[lVar13 + lVar10 + lVar6] <= lVar14);
          uVar16 = (uVar15 + (int)lVar1) - 1;
        }
LAB_001752c2:
        local_138[lVar9] = uVar16;
        lVar13 = lVar13 + (int)uVar4;
        lVar9 = lVar9 + 1;
      } while (lVar9 != lVar18);
      if (0 < sVar3) {
        pCVar5 = GA[lVar2].mapc;
        lVar9 = 0;
        lVar13 = 0;
        do {
          lVar14 = hi[lVar9];
          uVar15 = (uint)((double)lVar14 * GA[lVar2].scale[lVar9]);
          uVar4 = GA[lVar2].nblock[lVar9];
          uVar17 = uVar4 - 1;
          if (uVar4 == uVar15) {
            uVar15 = uVar17;
          }
          lVar10 = (long)(int)uVar15;
          if (lVar14 < pCVar5[lVar13 + lVar10]) {
            plVar12 = pCVar5 + lVar13 + ((ulong)uVar15 - 1);
            do {
              uVar16 = uVar17;
              if ((int)uVar15 < 1) break;
              uVar16 = uVar15 - 1;
              lVar10 = *plVar12;
              plVar12 = plVar12 + -1;
              uVar15 = uVar16;
            } while (lVar14 < lVar10);
          }
          else {
            uVar8 = uVar17;
            if ((int)uVar17 < (int)uVar15) {
              uVar8 = uVar15;
            }
            lVar11 = 0;
            do {
              uVar16 = uVar17;
              if ((int)uVar8 - lVar10 == lVar11) goto LAB_0017539e;
              lVar1 = lVar11 + 1;
              lVar6 = lVar11 + 1;
              lVar11 = lVar1;
            } while (pCVar5[lVar13 + lVar10 + lVar6] <= lVar14);
            uVar16 = (uVar15 + (int)lVar1) - 1;
          }
LAB_0017539e:
          local_178[lVar9] = uVar16;
          lVar13 = lVar13 + (int)uVar4;
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar18);
        *np = 0;
        if (sVar3 < 1) {
          lVar9 = 1;
        }
        else {
          memcpy(local_198,local_138,lVar18 * 4);
          lVar9 = 1;
          lVar13 = 0;
          do {
            lVar9 = lVar9 * (int)((local_178[lVar13] - local_138[lVar13]) + 1);
            lVar13 = lVar13 + 1;
          } while (lVar18 != lVar13);
          if (lVar9 < 1) {
            return 1;
          }
        }
        goto LAB_001754b9;
      }
    }
  }
  *np = 0;
  lVar9 = 1;
LAB_001754b9:
  lVar13 = 0;
  do {
    if (sVar3 < 1) {
      if (pgVar7[lVar2].num_rstrctd == 0) goto LAB_0017553d;
      if (0 < pgVar7[lVar2].num_rstrctd && 0 < sVar3) goto LAB_00175543;
    }
    else {
      lVar14 = 0;
      do {
        lVar14 = lVar14 + 1;
      } while (lVar18 != lVar14);
LAB_0017553d:
      if (0 < sVar3) {
LAB_00175543:
        lVar14 = 0;
        do {
          if ((int)local_198[lVar14] < (int)local_178[lVar14]) {
            local_198[lVar14] = local_198[lVar14] + 1;
            break;
          }
          local_198[lVar14] = local_138[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar18 != lVar14);
      }
    }
    lVar13 = lVar13 + 1;
    *np = lVar13;
    if (lVar13 == lVar9) {
      return 1;
    }
  } while( true );
}

Assistant:

logical pnga_locate_nnodes( Integer g_a,
                                 Integer *lo,
                                 Integer *hi,
                                 Integer *np)
/*    g_a      [input]  global array handle
      lo       [input]  lower indices of patch in global array
      hi       [input]  upper indices of patch in global array
      np       [output] total number of processors containing a portion
                        of the patch

      For a block cyclic data distribution, this function returns a list of
      blocks that cover the region along with the lower and upper indices of
      each block.
*/
{
  int  procT[MAXDIM], procB[MAXDIM], proc_subscript[MAXDIM];
  Integer  proc, i, ga_handle;
  Integer  d, dpos, ndim, elems, use_blocks;
  /* Integer  p_handle; */

  ga_check_handleM(g_a, "nga_locate_nnodes");

  ga_handle = GA_OFFSET + g_a;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))return FALSE;

  ndim = GA[ga_handle].ndim;

  if (GA[ga_handle].distr_type == REGULAR) {
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].nblock);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].nblock); 
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].nblock);
      (*np)++;
    }
  } else {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, j, tlo[MAXDIM], thi[MAXDIM], cnt;
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }
      /* store blocks that overlap request region in proclist */
      if (chk) {
        cnt++;
      }
    }
    *np = cnt;
  }
  return(TRUE);
}